

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::operator()
          (SymbolCompare *this,SymbolEntry *lhs,SymbolEntry *rhs)

{
  bool bVar1;
  size_type sVar2;
  uint uVar3;
  int iVar4;
  size_type __n;
  size_type __n_00;
  byte bVar5;
  ulong uVar6;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  *__return_storage_ptr__;
  StringPiece x;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  rhs_parts;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  lhs_parts;
  string local_b0;
  string local_90;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  local_70;
  pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
  local_50;
  
  __return_storage_ptr__ = &local_50;
  GetParts(__return_storage_ptr__,this,lhs);
  GetParts(&local_70,this,rhs);
  local_b0._0_16_ =
       stringpiece_internal::StringPiece::substr
                 (&__return_storage_ptr__->first,0,local_70.first.length_);
  x = stringpiece_internal::StringPiece::substr(&local_70.first,0,local_50.first.length_);
  uVar3 = stringpiece_internal::StringPiece::compare((StringPiece *)&local_b0,x);
  if (uVar3 == 0) {
    if (local_50.first.length_ != local_70.first.length_) {
      bVar1 = true;
      goto LAB_0038fbb2;
    }
    __n_00 = local_70.second.length_;
    if (local_50.second.length_ < local_70.second.length_) {
      __n_00 = local_50.second.length_;
    }
    iVar4 = memcmp(local_50.second.ptr_,local_70.second.ptr_,__n_00);
    if (iVar4 < 0) {
      __return_storage_ptr__ =
           (pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
            *)0x1;
    }
    else {
      __return_storage_ptr__ =
           (pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
            *)(ulong)(iVar4 == 0 && local_50.second.length_ < local_70.second.length_);
    }
  }
  else {
    __return_storage_ptr__ =
         (pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
          *)(ulong)(uVar3 >> 0x1f);
  }
  bVar1 = false;
LAB_0038fbb2:
  bVar5 = (byte)__return_storage_ptr__;
  if (bVar1) {
    SymbolEntry::AsString_abi_cxx11_(&local_b0,lhs,this->index);
    SymbolEntry::AsString_abi_cxx11_(&local_90,rhs,this->index);
    sVar2 = local_b0._M_string_length;
    __n = local_b0._M_string_length;
    if (local_90._M_string_length < local_b0._M_string_length) {
      __n = local_90._M_string_length;
    }
    if (__n == 0) {
      uVar6 = 0;
    }
    else {
      uVar3 = memcmp(local_b0._M_dataplus._M_p,local_90._M_dataplus._M_p,__n);
      uVar6 = (ulong)uVar3;
    }
    if ((int)uVar6 == 0) {
      uVar6 = 0xffffffff80000000;
      if (-0x80000000 < (long)(sVar2 - local_90._M_string_length)) {
        uVar6 = sVar2 - local_90._M_string_length;
      }
      if (0x7ffffffe < (long)uVar6) {
        uVar6 = 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    bVar5 = (byte)(uVar6 >> 0x1f) & 1;
    if ((StringPiece *)local_b0._M_dataplus._M_p != (StringPiece *)&local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool operator()(const T& lhs, const U& rhs) const {
      auto lhs_parts = GetParts(lhs);
      auto rhs_parts = GetParts(rhs);

      // Fast path to avoid making the whole string for common cases.
      if (int res =
              lhs_parts.first.substr(0, rhs_parts.first.size())
                  .compare(rhs_parts.first.substr(0, lhs_parts.first.size()))) {
        // If the packages already differ, exit early.
        return res < 0;
      } else if (lhs_parts.first.size() == rhs_parts.first.size()) {
        return lhs_parts.second < rhs_parts.second;
      }
      return AsString(lhs) < AsString(rhs);
    }